

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::
statement<std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&>
          (CompilerGLSL *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,
          char (*ts_1) [67],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2)

{
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_00;
  bool bVar1;
  uint local_4c;
  spirv_cross local_48 [4];
  uint32_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_local_2;
  char (*ts_local_1) [67];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_local;
  CompilerGLSL *this_local;
  
  local_28 = ts_2;
  ts_local_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_1;
  ts_local_1 = (char (*) [67])ts;
  ts_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  bVar1 = Compiler::is_forcing_recompilation(&this->super_Compiler);
  if (bVar1) {
    this->statement_count = this->statement_count + 1;
  }
  else if (this->redirect_statement ==
           (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            *)0x0) {
    for (local_4c = 0; local_4c < this->indent; local_4c = local_4c + 1) {
      StringStream<4096UL,_4096UL>::operator<<(&this->buffer,"    ");
    }
    statement_inner<std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&>
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_local_1,
               (char (*) [67])ts_local_2,local_28);
    StringStream<4096UL,_4096UL>::operator<<(&this->buffer,'\n');
  }
  else {
    this_00 = this->redirect_statement;
    join<std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&>
              (local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ts_local_1,(char (*) [67])ts_local_2,local_28);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_48);
    ::std::__cxx11::string::~string((string *)local_48);
    this->statement_count = this->statement_count + 1;
  }
  return;
}

Assistant:

inline void statement(Ts &&... ts)
	{
		if (is_forcing_recompilation())
		{
			// Do not bother emitting code while force_recompile is active.
			// We will compile again.
			statement_count++;
			return;
		}

		if (redirect_statement)
		{
			redirect_statement->push_back(join(std::forward<Ts>(ts)...));
			statement_count++;
		}
		else
		{
			for (uint32_t i = 0; i < indent; i++)
				buffer << "    ";
			statement_inner(std::forward<Ts>(ts)...);
			buffer << '\n';
		}
	}